

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::VertexCubeTextureCase::deinit(VertexCubeTextureCase *this)

{
  TextureCube *this_00;
  ShaderProgram *this_01;
  bool bVar1;
  bool bVar2;
  long lVar3;
  
  lVar3 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    this_00 = this->m_textures[lVar3];
    if (this_00 != (TextureCube *)0x0) {
      glu::TextureCube::~TextureCube(this_00);
    }
    operator_delete(this_00,0x180);
    this->m_textures[lVar3] = (TextureCube *)0x0;
    lVar3 = 1;
    bVar1 = false;
  } while (bVar2);
  this_01 = this->m_program;
  if (this_01 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_01);
  }
  operator_delete(this_01,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

void VertexCubeTextureCase::deinit (void)
{
	for (int i = 0; i < 2; i++)
	{
		delete m_textures[i];
		m_textures[i] = DE_NULL;
	}

	delete m_program;
	m_program = DE_NULL;
}